

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O2

void Aig_RManTableResize(Aig_RMan_t *p)

{
  uint uVar1;
  Aig_Tru_t **__ptr;
  Aig_Tru_t *pAVar2;
  int iVar3;
  Aig_Tru_t **ppAVar4;
  Aig_Tru_t *pAVar5;
  ulong uVar6;
  Aig_Tru_t *pAVar7;
  ulong uVar8;
  timespec local_40;
  
  if (p->pBins == (Aig_Tru_t **)0x0) {
    __assert_fail("p->pBins != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigCanon.c"
                  ,0xb4,"void Aig_RManTableResize(Aig_RMan_t *)");
  }
  clock_gettime(3,&local_40);
  __ptr = p->pBins;
  uVar1 = p->nBins;
  iVar3 = Abc_PrimeCudd(uVar1 * 3);
  p->nBins = iVar3;
  ppAVar4 = (Aig_Tru_t **)calloc((long)iVar3,8);
  p->pBins = ppAVar4;
  uVar6 = 0;
  uVar8 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar8 = uVar6;
  }
  iVar3 = 0;
  do {
    if (uVar6 == uVar8) {
      if (iVar3 != p->nEntries) {
        __assert_fail("Counter == p->nEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigCanon.c"
                      ,0xca,"void Aig_RManTableResize(Aig_RMan_t *)");
      }
      free(__ptr);
      return;
    }
    pAVar7 = __ptr[uVar6];
    if (pAVar7 != (Aig_Tru_t *)0x0) goto LAB_004f3dd9;
    pAVar2 = (Aig_Tru_t *)0x0;
    while (pAVar5 = pAVar2, pAVar7 != (Aig_Tru_t *)0x0) {
      ppAVar4 = Aig_RManTableLookup(p,(uint *)(pAVar7 + 1),*(uint *)&pAVar7->field_0xc >> 0x1b);
      if (*ppAVar4 != (Aig_Tru_t *)0x0) {
        __assert_fail("*ppPlace == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigCanon.c"
                      ,0xc4,"void Aig_RManTableResize(Aig_RMan_t *)");
      }
      *ppAVar4 = pAVar7;
      pAVar7->pNext = (Aig_Tru_t *)0x0;
      iVar3 = iVar3 + 1;
      pAVar2 = (Aig_Tru_t *)0x0;
      pAVar7 = pAVar5;
      if (pAVar5 != (Aig_Tru_t *)0x0) {
LAB_004f3dd9:
        pAVar2 = pAVar7->pNext;
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void Aig_RManTableResize( Aig_RMan_t * p )
{
    Aig_Tru_t * pEntry, * pNext;
    Aig_Tru_t ** pBinsOld, ** ppPlace;
    int nBinsOld, Counter, i;
    abctime clk;
    assert( p->pBins != NULL );
clk = Abc_Clock();
    // save the old Bins
    pBinsOld = p->pBins;
    nBinsOld = p->nBins;
    // get the new Bins
    p->nBins = Abc_PrimeCudd( 3 * nBinsOld ); 
    p->pBins = ABC_CALLOC( Aig_Tru_t *, p->nBins );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < nBinsOld; i++ )
    for ( pEntry = pBinsOld[i], pNext = pEntry? pEntry->pNext : NULL; 
          pEntry; pEntry = pNext, pNext = pEntry? pEntry->pNext : NULL )
    {
        // get the place where this entry goes in the Bins 
        ppPlace = Aig_RManTableLookup( p, pEntry->pTruth, pEntry->nVars );
        assert( *ppPlace == NULL ); // should not be there
        // add the entry to the list
        *ppPlace = pEntry;
        pEntry->pNext = NULL;
        Counter++;
    }
    assert( Counter == p->nEntries );
//    ABC_PRT( "Time", Abc_Clock() - clk );
    ABC_FREE( pBinsOld );
}